

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontAtlas::GetTexDataAsAlpha8
          (ImFontAtlas *this,uchar **out_pixels,int *out_width,int *out_height,
          int *out_bytes_per_pixel)

{
  bool bVar1;
  ImFontAtlas *in_RCX;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  ImFontConfig *in_stack_00000078;
  ImFontAtlas *in_stack_00000080;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    bVar1 = ImVector<ImFontConfig>::empty((ImVector<ImFontConfig> *)(in_RDI + 0x60));
    if (bVar1) {
      AddFontDefault(in_stack_00000080,in_stack_00000078);
    }
    Build(in_RCX);
  }
  *in_RSI = *(undefined8 *)(in_RDI + 0x18);
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = *(undefined4 *)(in_RDI + 0x28);
  }
  if (in_RCX != (ImFontAtlas *)0x0) {
    *(undefined4 *)in_RCX = *(undefined4 *)(in_RDI + 0x2c);
  }
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 1;
  }
  return;
}

Assistant:

void    ImFontAtlas::GetTexDataAsAlpha8(unsigned char** out_pixels, int* out_width, int* out_height, int* out_bytes_per_pixel)
{
    // Build atlas on demand
    if (TexPixelsAlpha8 == NULL)
    {
        if (ConfigData.empty())
            AddFontDefault();
        Build();
    }

    *out_pixels = TexPixelsAlpha8;
    if (out_width) *out_width = TexWidth;
    if (out_height) *out_height = TexHeight;
    if (out_bytes_per_pixel) *out_bytes_per_pixel = 1;
}